

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O0

string * WeatherGetSource_abi_cxx11_(void)

{
  bool bVar1;
  WeatherCtrlTy WVar2;
  uint uVar3;
  char *__a;
  ulong uVar4;
  string *in_RDI;
  char t [100];
  int source;
  int preset;
  string *s;
  size_type in_stack_fffffffffffffeb8;
  array<const_char_*,_10UL> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  allocator<char> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_d3;
  allocator<char> local_d2;
  allocator<char> local_d1;
  string local_d0 [32];
  string local_b0 [33];
  undefined1 local_8f;
  allocator<char> local_8e;
  undefined1 local_8d [21];
  char local_78 [104];
  int local_10;
  int local_c;
  
  local_c = XDR_int::get((XDR_int *)0x238f58);
  if ((local_c < 0) || (8 < local_c)) {
    local_c = 9;
  }
  local_10 = XDR_int::get((XDR_int *)0x238f8a);
  if ((local_10 < 0) || (3 < local_10)) {
    local_10 = 4;
  }
  bVar1 = WeatherInControl();
  if (bVar1) {
    WVar2 = DataRefs::GetWeatherControl(&dataRefs);
    if ((uint)(WVar2 + WC_METAR_XP) < 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      std::allocator<char>::~allocator(&local_8e);
    }
    else if (WVar2 == WC_METAR_XP) {
      bVar1 = WeatherIsXPRealWeather();
      __a = "METAR up to";
      if (bVar1) {
        __a = "XP\'s real weather above";
      }
      uVar3 = DataRefs::GetWeatherMaxMetarHeight_ft(&dataRefs);
      __s = local_78;
      snprintf(__s,100,"LiveTraffic, using %s %dft AGL",__a,(ulong)uVar3);
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8d;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this,__s,(allocator<char> *)__a);
      std::allocator<char>::~allocator((allocator<char> *)local_8d);
    }
    else if (WVar2 == WC_REAL_TRAFFIC) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      std::allocator<char>::~allocator((allocator<char> *)(local_8d + 0x14));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      std::allocator<char>::~allocator(&local_d3);
    }
  }
  else if (local_10 == 0) {
    local_8f = 0;
    std::array<const_char_*,_5UL>::operator[]
              ((array<const_char_*,_5UL> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    std::operator+(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
    std::array<const_char_*,_10UL>::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::operator+(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,", set from given METAR");
    }
  }
  else {
    std::array<const_char_*,_5UL>::operator[]
              ((array<const_char_*,_5UL> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    std::allocator<char>::~allocator(&local_d2);
  }
  return in_RDI;
}

Assistant:

std::string WeatherGetSource ()
{
    // Preset closest to current conditions
    static std::array<const char*,10> WEATHER_PRESETS = {
        "Clear", "VFR Few", "VFR Scattered", "VFR Broken", "VFR Marginal", "IFR Non-precision", "IFR Precision", "Convective", "Large-cell Storms", "Unknown"
    };
    int preset = wdr_weather_preset.get();
    if (preset < 0 || preset > 8) preset = 9;           // 'Unknown'

    // Weather Source
    static std::array<const char*,5> WEATHER_SOURCES = {
        "X-Plane Preset", "X-Plane Real Weather", "Controlpad", "Plugin", "Unknown"
    };
    int source = wdr_weather_source.get();
    if (source < 0 || source > 3) source = 4;

    // Are we in control? Say so!
    if (WeatherInControl()) {
        char t[100];
        switch (dataRefs.GetWeatherControl()) {
            case WC_REAL_TRAFFIC:
                return "LiveTraffic using RealTraffic weather data";
            case WC_METAR_XP:
                snprintf(t, sizeof(t), "LiveTraffic, using %s %dft AGL",
                         (WeatherIsXPRealWeather() ? "XP's real weather above" : "METAR up to"),
                         dataRefs.GetWeatherMaxMetarHeight_ft());
                return std::string(t);
            case WC_NONE:
            case WC_INIT:
                return std::string("LiveTraffic, unknown");
        }
    }
    else if (source == 0) {                             // 'Preset'
        std::string s = std::string(WEATHER_SOURCES[size_t(source)]) + ", " + WEATHER_PRESETS[size_t(preset)];
        if (!setWeather.metar.empty()) {
            s += ", set from given METAR";
        }
        return s;
    }
    else
        return std::string(WEATHER_SOURCES[size_t(source)]);
    
    // Shouldn't be able to get here
    return "?";
}